

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

bool cmCTestScriptHandler::EmptyBinaryDirectory(string *sname)

{
  bool bVar1;
  ulong uVar2;
  int local_ac;
  int i;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string check;
  string *sname_local;
  
  check.field_2._8_8_ = sname;
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < 2) {
    sname_local._7_1_ = false;
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists((string *)check.field_2._8_8_);
    if (bVar1) {
      cmAlphaNum::cmAlphaNum(&local_68,(string *)check.field_2._8_8_);
      cmAlphaNum::cmAlphaNum(&local_98,"/CMakeCache.txt");
      cmStrCat<>((string *)local_38,&local_68,&local_98);
      bVar1 = cmsys::SystemTools::FileExists((string *)local_38);
      if (bVar1) {
        for (local_ac = 0; local_ac < 5; local_ac = local_ac + 1) {
          bVar1 = TryToRemoveBinaryDirectoryOnce((string *)check.field_2._8_8_);
          if (bVar1) {
            sname_local._7_1_ = true;
            goto LAB_001ff189;
          }
          cmsys::SystemTools::Delay(100);
        }
        sname_local._7_1_ = false;
      }
      else {
        sname_local._7_1_ = false;
      }
LAB_001ff189:
      std::__cxx11::string::~string((string *)local_38);
    }
    else {
      sname_local._7_1_ = true;
    }
  }
  return sname_local._7_1_;
}

Assistant:

bool cmCTestScriptHandler::EmptyBinaryDirectory(const std::string& sname)
{
  // try to avoid deleting root
  if (sname.size() < 2) {
    return false;
  }

  // consider non existing target directory a success
  if (!cmSystemTools::FileExists(sname)) {
    return true;
  }

  // try to avoid deleting directories that we shouldn't
  std::string check = cmStrCat(sname, "/CMakeCache.txt");

  if (!cmSystemTools::FileExists(check)) {
    return false;
  }

  for (int i = 0; i < 5; ++i) {
    if (TryToRemoveBinaryDirectoryOnce(sname)) {
      return true;
    }
    cmSystemTools::Delay(100);
  }

  return false;
}